

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_dense.c
# Opt level: O2

void SUNDenseMatrix_Print(SUNMatrix A,FILE *outfile)

{
  long *plVar1;
  long lVar2;
  long lVar3;
  
  fputc(10,(FILE *)outfile);
  for (lVar2 = 0; plVar1 = (long *)A->content, lVar2 < *plVar1; lVar2 = lVar2 + 1) {
    for (lVar3 = 0; lVar3 < plVar1[1]; lVar3 = lVar3 + 1) {
      fprintf((FILE *)outfile,"% .15e  ",
              *(undefined8 *)(*(long *)(plVar1[4] + lVar3 * 8) + lVar2 * 8));
      plVar1 = (long *)A->content;
    }
    fputc(10,(FILE *)outfile);
  }
  return;
}

Assistant:

void SUNDenseMatrix_Print(SUNMatrix A, FILE* outfile)
{
  SUNFunctionBegin(A->sunctx);
  sunindextype i, j;

  SUNAssertVoid(SUNMatGetID(A) == SUNMATRIX_DENSE, SUN_ERR_ARG_WRONGTYPE);

  /* perform operation */
  fprintf(outfile, "\n");
  for (i = 0; i < SM_ROWS_D(A); i++)
  {
    for (j = 0; j < SM_COLUMNS_D(A); j++)
    {
      fprintf(outfile, SUN_FORMAT_E "  ", SM_ELEMENT_D(A, i, j));
    }
    fprintf(outfile, "\n");
  }
  return;
}